

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O1

BitmapDibHeader * Bitmap_Operation::getInfoHeader(uint32_t size)

{
  BitmapDibHeader *pBVar1;
  
  if (size == 0x28) {
    pBVar1 = (BitmapDibHeader *)operator_new(0x38);
    pBVar1->_vptr_BitmapDibHeader = (_func_int **)&PTR__BitmapDibHeader_00120bf8;
    pBVar1[1]._vptr_BitmapDibHeader = (_func_int **)0x28;
    pBVar1[2]._vptr_BitmapDibHeader = (_func_int **)0x8000100000000;
    pBVar1[3]._vptr_BitmapDibHeader = (_func_int **)0x0;
    pBVar1[4]._vptr_BitmapDibHeader = (_func_int **)0x0;
    pBVar1[5]._vptr_BitmapDibHeader = (_func_int **)0x0;
    *(undefined4 *)&pBVar1[6]._vptr_BitmapDibHeader = 0x28;
  }
  else if (size == 0xc) {
    pBVar1 = (BitmapDibHeader *)operator_new(0x18);
    pBVar1->_vptr_BitmapDibHeader = (_func_int **)&PTR__BitmapDibHeader_00120b58;
    *(undefined4 *)&pBVar1[1]._vptr_BitmapDibHeader = 0xc;
    *(undefined8 *)((long)&pBVar1[1]._vptr_BitmapDibHeader + 4) = 0x100000000;
    *(undefined4 *)((long)&pBVar1[2]._vptr_BitmapDibHeader + 4) = 0xc;
  }
  else {
    pBVar1 = (BitmapDibHeader *)0x0;
  }
  return pBVar1;
}

Assistant:

BitmapDibHeader * getInfoHeader( uint32_t size )
    {
        switch( size )
        {
            case 12u:
                return new BitmapCoreHeader;
            case 40u:
                return new BitmapInfoHeader;
            default:
                return nullptr;
        }
    }